

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastcodegen.cpp
# Opt level: O0

bool __thiscall
SQCompilation::CodegenVisitor::CheckMemberUniqueness
          (CodegenVisitor *this,ArenaVector<SQCompilation::Expr_*> *vec,Expr *obj)

{
  bool bVar1;
  TreeOp TVar2;
  size_type_conflict sVar3;
  int iVar4;
  LiteralKind LVar5;
  Expr **ppEVar6;
  Id *pIVar7;
  SQChar *pSVar8;
  SQUnsignedInteger SVar9;
  Node *in_RDX;
  ArenaVector<SQCompilation::Expr_*> *in_RSI;
  CodegenVisitor *in_RDI;
  char b_1 [32];
  LiteralExpr *b;
  LiteralExpr *a;
  Expr *vecobj;
  SQUnsignedInteger n;
  SQUnsignedInteger i;
  Expr **in_stack_ffffffffffffff68;
  ArenaVector<SQCompilation::Expr_*> *in_stack_ffffffffffffff70;
  char *__s;
  LiteralExpr *in_stack_ffffffffffffff80;
  LiteralExpr *in_stack_ffffffffffffff88;
  char local_68 [32];
  Node *local_48;
  LiteralExpr *local_40;
  LiteralExpr *local_38;
  ulong local_30;
  ulong local_28;
  Node *local_20;
  ArenaVector<SQCompilation::Expr_*> *local_18;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  TVar2 = Node::op(in_RDX);
  if ((TVar2 == TO_LITERAL) || (TVar2 = Node::op(local_20), TVar2 == TO_ID)) {
    local_28 = 0;
    sVar3 = ArenaVector<SQCompilation::Expr_*>::size(local_18);
    local_30 = (ulong)sVar3;
    for (; local_28 < local_30; local_28 = local_28 + 1) {
      ppEVar6 = ArenaVector<SQCompilation::Expr_*>::operator[]
                          (local_18,(size_type_conflict)local_28);
      local_38 = (LiteralExpr *)*ppEVar6;
      TVar2 = Node::op((Node *)local_38);
      if ((TVar2 == TO_ID) && (TVar2 = Node::op(local_20), TVar2 == TO_ID)) {
        pIVar7 = Node::asId((Node *)local_38);
        in_stack_ffffffffffffff88 = (LiteralExpr *)Id::id(pIVar7);
        pIVar7 = Node::asId(local_20);
        pSVar8 = Id::id(pIVar7);
        iVar4 = strcmp((char *)in_stack_ffffffffffffff88,pSVar8);
        if (iVar4 == 0) {
          pIVar7 = Node::asId(local_20);
          pSVar8 = Id::id(pIVar7);
          reportDiagnostic(in_RDI,local_20,0x30,pSVar8);
          return false;
        }
      }
      else {
        TVar2 = Node::op((Node *)local_38);
        if ((TVar2 == TO_LITERAL) && (TVar2 = Node::op(local_20), TVar2 == TO_LITERAL)) {
          local_40 = local_38;
          local_48 = local_20;
          bVar1 = compareLiterals(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
          if (bVar1) {
            LVar5 = LiteralExpr::kind(local_40);
            if (LVar5 == LK_STRING) {
              pSVar8 = LiteralExpr::s(local_40);
              reportDiagnostic(in_RDI,local_20,0x30,pSVar8);
            }
            else {
              memset(local_68,0,0x20);
              __s = local_68;
              SVar9 = LiteralExpr::raw(local_40);
              snprintf(__s,0x20,"%lu",SVar9);
              reportDiagnostic(in_RDI,local_20,0x30,local_68);
            }
            return false;
          }
        }
      }
    }
    ArenaVector<SQCompilation::Expr_*>::push_back
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  return true;
}

Assistant:

bool CodegenVisitor::CheckMemberUniqueness(ArenaVector<Expr *> &vec, Expr *obj) {

    if (obj->op() != TO_LITERAL && obj->op() != TO_ID) return true;

    for (SQUnsignedInteger i = 0, n = vec.size(); i < n; ++i) {
        Expr *vecobj = vec[i];
        if (vecobj->op() == TO_ID && obj->op() == TO_ID) {
            if (strcmp(vecobj->asId()->id(), obj->asId()->id()) == 0) {
                reportDiagnostic(obj, DiagnosticsId::DI_DUPLICATE_KEY, obj->asId()->id());
                return false;
            }
            continue;
        }
        if (vecobj->op() == TO_LITERAL && obj->op() == TO_LITERAL) {
            LiteralExpr *a = (LiteralExpr*)vecobj;
            LiteralExpr *b = (LiteralExpr*)obj;
            if (compareLiterals(a, b)) {
                if (a->kind() == LK_STRING) {
                    reportDiagnostic(obj, DiagnosticsId::DI_DUPLICATE_KEY, a->s());
                }
                else {
                    char b[32] = { 0 };
                    snprintf(b, sizeof b, "%" SQ_UINT_FMT, a->raw());
                    reportDiagnostic(obj, DiagnosticsId::DI_DUPLICATE_KEY, b);
                }
                return false;
            }
            continue;
        }
    }

    vec.push_back(obj);
    return true;
}